

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::FormatArg::formatImpl<std::atomic<int>>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  ostream *out_00;
  
  out_00 = *(ostream **)(in_FS_OFFSET + 0x28);
  formatValue<std::atomic<int>>
            (out_00,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),
             (atomic<int> *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  if (*(ostream **)(in_FS_OFFSET + 0x28) == out_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }